

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_SetMonitoringMode
               (UA_Server *server,UA_Session *session,UA_SetMonitoringModeRequest *request,
               UA_SetMonitoringModeResponse *response)

{
  UA_MonitoringMode UVar1;
  UA_StatusCode UVar2;
  UA_Subscription *sub;
  UA_StatusCode *pUVar3;
  UA_MonitoredItem *mon;
  size_t size;
  size_t i;
  ulong uVar4;
  
  sub = UA_Session_getSubscriptionByID(session,request->subscriptionId);
  if (sub == (UA_Subscription *)0x0) {
    UVar2 = 0x80280000;
  }
  else {
    size = request->monitoredItemIdsSize;
    if (size == 0) {
      UVar2 = 0x800f0000;
    }
    else {
      pUVar3 = (UA_StatusCode *)UA_Array_new(size,UA_TYPES + 0x12);
      response->results = pUVar3;
      if (pUVar3 != (UA_StatusCode *)0x0) {
        response->resultsSize = size;
        for (uVar4 = 0; uVar4 < size; uVar4 = uVar4 + 1) {
          mon = UA_Subscription_getMonitoredItem(sub,request->monitoredItemIds[uVar4]);
          if (mon == (UA_MonitoredItem *)0x0) {
            response->results[uVar4] = 0x80420000;
          }
          else {
            UVar1 = request->monitoringMode;
            if (UVar1 != mon->monitoringMode) {
              mon->monitoringMode = UVar1;
              if (UVar1 == UA_MONITORINGMODE_REPORTING) {
                MonitoredItem_registerSampleJob(server,mon);
              }
              else {
                MonitoredItem_unregisterSampleJob(server,mon);
              }
            }
          }
          size = response->resultsSize;
        }
        return;
      }
      UVar2 = 0x80030000;
    }
  }
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void Service_SetMonitoringMode(UA_Server *server, UA_Session *session,
                               const UA_SetMonitoringModeRequest *request,
                               UA_SetMonitoringModeResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing SetMonitoringMode");
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    if(request->monitoredItemIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_Array_new(request->monitoredItemIdsSize, &UA_TYPES[UA_TYPES_STATUSCODE]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->monitoredItemIdsSize;

    for(size_t i = 0; i < response->resultsSize; ++i) {
        UA_MonitoredItem *mon =
            UA_Subscription_getMonitoredItem(sub, request->monitoredItemIds[i]);
        if(!mon) {
            response->results[i] = UA_STATUSCODE_BADMONITOREDITEMIDINVALID;
            continue;
        }
        if(request->monitoringMode == mon->monitoringMode)
            continue;
        mon->monitoringMode = request->monitoringMode;
        if(mon->monitoringMode == UA_MONITORINGMODE_REPORTING)
            MonitoredItem_registerSampleJob(server, mon);
        else
            MonitoredItem_unregisterSampleJob(server, mon);
    }
}